

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

void calcBias<Blob<448>,unsigned_int>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  code *in_RDI;
  byte in_R8B;
  int bitB;
  int bitA;
  int iOut;
  int iBit;
  int *cursor;
  int irep;
  uint B;
  uint A;
  Blob<448> K;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  uint32_t local_88;
  uint32_t local_84;
  int *in_stack_ffffffffffffff80;
  int iVar3;
  undefined4 in_stack_ffffffffffffff8c;
  Rand *in_stack_ffffffffffffff90;
  
  Blob<448>::Blob((Blob<448> *)&stack0xffffffffffffff94);
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    if (((in_R8B & 1) != 0) && (iVar3 % (in_EDX / 10) == 0)) {
      printf(".");
    }
    Rand::rand_p(in_stack_ffffffffffffff90,(void *)CONCAT44(in_stack_ffffffffffffff8c,iVar3),
                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    (*in_RDI)(&stack0xffffffffffffff94,0x38,0,&stack0xffffffffffffff90);
    in_stack_ffffffffffffff80 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,0);
    for (local_84 = 0; (int)local_84 < 0x1c0; local_84 = local_84 + 1) {
      flipbit(&stack0xffffffffffffff94,0x38,local_84);
      (*in_RDI)(&stack0xffffffffffffff94,0x38,0,&stack0xffffffffffffff8c);
      flipbit(&stack0xffffffffffffff94,0x38,local_84);
      for (local_88 = 0; (int)local_88 < 0x20; local_88 = local_88 + 1) {
        uVar1 = getbit(&stack0xffffffffffffff90,4,local_88);
        uVar2 = getbit(&stack0xffffffffffffff8c,4,local_88);
        *in_stack_ffffffffffffff80 = (uVar1 ^ uVar2) + *in_stack_ffffffffffffff80;
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}